

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverAPGD.h
# Opt level: O2

void __thiscall chrono::ChSolverAPGD::~ChSolverAPGD(ChSolverAPGD *this)

{
  ~ChSolverAPGD(this);
  ::operator_delete(this,0x148);
  return;
}

Assistant:

~ChSolverAPGD() {}